

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.cpp
# Opt level: O2

void test_divceil<std::vector<unsigned_short,std::allocator<unsigned_short>>,signed_char>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *values,char divisor,
               size_t attempt_count)

{
  unsigned_short uVar1;
  long lVar2;
  long lVar3;
  ostream *poVar4;
  ushort uVar5;
  bool bVar6;
  
  uVar5 = 0;
  lVar2 = std::chrono::_V2::steady_clock::now();
  while (bVar6 = attempt_count != 0, attempt_count = attempt_count - 1, bVar6) {
    uVar1 = std::
            accumulate<__gnu_cxx::__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,unsigned_short,test_divceil<std::vector<unsigned_short,std::allocator<unsigned_short>>,signed_char>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&,signed_char,unsigned_long)::_lambda(auto:1,auto:2)_1_>
                      ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        )(values->
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        )(values->
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                         _M_impl.super__Vector_impl_data._M_finish,0,
                       (anon_class_1_1_e7267f7e)divisor);
    uVar5 = uVar5 + uVar1;
  }
  lVar3 = std::chrono::_V2::steady_clock::now();
  poVar4 = (ostream *)std::ostream::operator<<(&std::clog,uVar5);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator<<((ostream *)&std::cout,anon_var_dwarf_1fcde);
  poVar4 = std::ostream::_M_insert<double>((double)(lVar3 - lVar2) / 1000000000.0);
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void test_divceil (const Container & values, Integer divisor, std::size_t attempt_count)
{
    using namespace std::chrono;
    using value_type = typename Container::value_type;

    const auto start_time = steady_clock::now();

    auto total = value_type{0};
    for (std::size_t iteration = 0; iteration < attempt_count; ++iteration)
    {
        auto r =
            std::accumulate(values.begin(), values.end(), value_type{0},
                [divisor] (auto a, auto b)
                {
                    return a + burst::divceil(b, divisor);
                });
        // Убогий ГЦЦ не может осилить оператор `+=`.
        total = static_cast<value_type>(total + r);
    }

    const auto total_time = steady_clock::now() - start_time;

    std::clog << total << std::endl;
    const auto time = duration_cast<duration<double>>(total_time).count();
    std::cout << "Время: " << time << std::endl;
}